

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

FiniteAutomaton *
Omega_h::FiniteAutomaton::make_deterministic
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *nfa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  iterator iVar6;
  _Rb_tree_header *p_Var7;
  long lVar8;
  StateSetUniqPtrVector ssupv;
  StateSet next_ss;
  StateSetPtr2State ssp2s;
  StateSetUniqPtrVector local_178;
  set<int,_std::less<int>,_std::allocator<int>_> *local_158;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_150;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_120;
  _Rb_tree_node_base local_118;
  size_t local_f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f0;
  _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>,_std::_Select1st<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
  local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  if (nfa->is_deterministic == true) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,
               (vector<int,_std::allocator<int>_> *)nfa);
    (__return_storage_ptr__->table).ncols = (nfa->table).ncols;
    std::vector<int,_std::allocator<int>_>::vector
              (&__return_storage_ptr__->accepted_tokens,&nfa->accepted_tokens);
    __return_storage_ptr__->is_deterministic = nfa->is_deterministic;
  }
  else {
    local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c0._M_impl.super__Rb_tree_header._M_header;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_178.
    super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.
    super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    FiniteAutomaton(__return_storage_ptr__,(nfa->table).ncols + -2,true,0);
    p_Var7 = &local_f0._M_impl.super__Rb_tree_header;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_150._M_impl._0_8_ = (ulong)(uint)local_150._M_impl._4_4_ << 0x20;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_f0,(int *)&local_150);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_90,&local_f0);
    get_epsilon_closure((StateSet *)&local_150,(StateSet *)&local_90,nfa);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
              (&local_f0);
    if (local_150._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      local_f0._M_impl.super__Rb_tree_header._M_header._M_color =
           local_150._M_impl.super__Rb_tree_header._M_header._M_color;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_150._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
           local_150._M_impl.super__Rb_tree_header._M_header._M_left;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_150._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_150._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var7->_M_header;
      local_f0._M_impl.super__Rb_tree_header._M_node_count =
           local_150._M_impl.super__Rb_tree_header._M_node_count;
      local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_150._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Rb_tree_node_base *)((long)&local_150 + 8U);
      local_150._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Rb_tree_node_base *)((long)&local_150 + 8U);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_150);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_90);
    emplace_back(&local_178,(StateSet *)&local_f0);
    iVar1 = add_state(__return_storage_ptr__);
    local_150._M_impl._0_8_ =
         local_178.
         super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
         .super__Head_base<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_false>.
         _M_head_impl;
    pmVar4 = std::
             map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
             ::operator[]((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                           *)&local_c0,(key_type *)&local_150);
    *pmVar4 = iVar1;
    if (0 < (int)((ulong)((long)local_178.
                                super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_178.
                               super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar8 = 0;
      do {
        local_158 = local_178.
                    super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                    super___uniq_ptr_impl<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    .
                    super__Head_base<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_false>
                    ._M_head_impl;
        if (0 < (int)((nfa->table).ncols + (uint)nfa->is_deterministic * 2 + -2)) {
          p_Var7 = (_Rb_tree_header *)((long)&(local_158->_M_t)._M_impl + 8);
          iVar1 = 0;
          do {
            local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_150._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)((long)&local_150 + 8);
            local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
            p_Var5 = *(_Base_ptr *)((long)&(local_158->_M_t)._M_impl.super__Rb_tree_header + 0x10);
            local_150._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_150._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)p_Var5 != p_Var7) {
              do {
                iVar2 = step(nfa,p_Var5[1]._M_color,iVar1);
                local_120 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                             *)CONCAT44(local_120._4_4_,iVar2);
                if (iVar2 != -1) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&local_150,(int *)&local_120);
                }
                p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
              } while ((_Rb_tree_header *)p_Var5 != p_Var7);
              if (local_150._M_impl.super__Rb_tree_header._M_node_count != 0) {
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _Rb_tree(&local_60,&local_150);
                get_epsilon_closure((StateSet *)&local_120,(StateSet *)&local_60,nfa);
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                clear(&local_150);
                if (local_118._M_parent != (_Base_ptr)0x0) {
                  local_150._M_impl.super__Rb_tree_header._M_header._M_color = local_118._M_color;
                  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = local_118._M_parent;
                  local_150._M_impl.super__Rb_tree_header._M_header._M_left = local_118._M_left;
                  local_150._M_impl.super__Rb_tree_header._M_header._M_right = local_118._M_right;
                  (local_118._M_parent)->_M_parent = (_Base_ptr)((long)&local_150 + 8);
                  local_150._M_impl.super__Rb_tree_header._M_node_count = local_f8;
                  local_118._M_parent = (_Base_ptr)0x0;
                  local_118._M_left = &local_118;
                  local_f8 = 0;
                  local_118._M_right = local_118._M_left;
                }
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)&local_120);
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree(&local_60);
                local_120 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                             *)&local_150;
                iVar6 = std::
                        _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>,_std::_Select1st<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                        ::find(&local_c0,(key_type *)&local_120);
                if ((_Rb_tree_header *)iVar6._M_node == &local_c0._M_impl.super__Rb_tree_header) {
                  iVar2 = add_state(__return_storage_ptr__);
                  emplace_back(&local_178,(StateSet *)&local_150);
                  local_120 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                               *)local_178.
                                 super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                                 super___uniq_ptr_impl<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_false>
                                 ._M_head_impl;
                  pmVar4 = std::
                           map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                           ::operator[]((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                                         *)&local_c0,(key_type *)&local_120);
                  *pmVar4 = iVar2;
                }
                else {
                  iVar2 = *(int *)&iVar6._M_node[1]._M_parent;
                }
                add_transition(__return_storage_ptr__,(int)lVar8,iVar1,iVar2);
              }
            }
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_150);
            iVar1 = iVar1 + 1;
          } while (iVar1 < (int)((nfa->table).ncols + (uint)nfa->is_deterministic * 2 + -2));
        }
        p_Var5 = (local_158->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var7 = &(local_158->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var5 != p_Var7) {
          iVar1 = -1;
          do {
            iVar3 = accepts(nfa,p_Var5[1]._M_color);
            iVar2 = iVar1;
            if (iVar3 < iVar1) {
              iVar2 = iVar3;
            }
            if (iVar1 == -1) {
              iVar2 = iVar3;
            }
            if (iVar3 != -1) {
              iVar1 = iVar2;
            }
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          } while ((_Rb_tree_header *)p_Var5 != p_Var7);
          if (iVar1 != -1) {
            add_accept(__return_storage_ptr__,(int)lVar8,iVar1);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)((ulong)((long)local_178.
                                           super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_178.
                                          super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_f0);
    std::
    vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::~vector(&local_178);
    std::
    _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>,_std::_Select1st<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
    ::~_Rb_tree(&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::make_deterministic(
    FiniteAutomaton const& nfa) {
  if (get_determinism(nfa)) return nfa;
  StateSetPtr2State ssp2s;
  StateSetUniqPtrVector ssupv;
  FiniteAutomaton out(get_nsymbols(nfa), true, 0);
  StateSet start_ss;
  start_ss.insert(0);
  start_ss = get_epsilon_closure(start_ss, nfa);
  emplace_back(ssupv, start_ss);
  ssp2s[ssupv.back().get()] = add_state(out);
  int front = 0;
  while (front < int(ssupv.size())) {
    auto state = front;
    auto& ss = *at(ssupv, front);
    ++front;
    for (int symbol = 0; symbol < get_nsymbols(nfa); ++symbol) {
      auto next_ss = Omega_h::step(ss, symbol, nfa);
      if (next_ss.empty()) continue;
      next_ss = get_epsilon_closure(next_ss, nfa);
      int next_state;
      auto it = ssp2s.find(&next_ss);
      if (it == ssp2s.end()) {
        next_state = add_state(out);
        emplace_back(ssupv, next_ss);
        ssp2s[ssupv.back().get()] = next_state;
      } else {
        next_state = it->second;
      }
      add_transition(out, state, symbol, next_state);
    }
    int min_accepted = -1;
    for (auto nfa_state : ss) {
      auto nfa_token = accepts(nfa, nfa_state);
      if (nfa_token == -1) continue;
      if (min_accepted == -1 || nfa_token < min_accepted) {
        min_accepted = nfa_token;
      }
    }
    if (min_accepted != -1) add_accept(out, state, min_accepted);
  }
  return out;
}